

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O1

VOID PAL_Leave(PAL_Boundary boundary)

{
  CPalThread *pCVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    pCVar1 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pCVar1 == (CPalThread *)0x0) {
      pCVar1 = CreateCurrentThreadData();
    }
    if (pCVar1->m_fInPal == false) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c67a;
    }
    else {
      pCVar1->m_fInPal = false;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
LAB_0012c67a:
  abort();
}

Assistant:

VOID
PALAPI
PAL_Leave(PAL_Boundary boundary)
{
    ENTRY("PAL_Leave(boundary=%u)\n", boundary);

    CPalThread *pThread = InternalGetCurrentThread();
    // We ignore the return code.  This call should only fail on internal
    // error, and we assert at the actual failure.
    pThread->Leave(boundary);

    LOGEXIT("PAL_Leave returns\n");
}